

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get.hpp
# Opt level: O1

enable_if_t<detail::is_chrono_duration<duration<long,_ratio<1L,_1000000000L>_>_>::value,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
 toml::get<std::chrono::duration<long,std::ratio<1l,1000000000l>>,toml::type_config>
           (basic_value<toml::type_config> *v)

{
  local_time_type *plVar1;
  
  plVar1 = basic_value<toml::type_config>::as_local_time(v);
  return (enable_if_t<detail::is_chrono_duration<duration<long,_ratio<1L,_1000000000L>_>_>::value,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          )((ulong)plVar1->hour * 3600000000000 + (ulong)plVar1->minute * 60000000000 +
           (ulong)plVar1->second * 1000000000 + (ulong)plVar1->millisecond * 1000000 +
           (ulong)plVar1->microsecond * 1000 + (ulong)plVar1->nanosecond);
}

Assistant:

cxx::enable_if_t<detail::is_chrono_duration<T>::value, T>
get(const basic_value<TC>& v)
{
    return std::chrono::duration_cast<T>(
            std::chrono::nanoseconds(v.as_local_time()));
}